

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine.cpp
# Opt level: O1

void __thiscall QPaintEngine::drawTextItem(QPaintEngine *this,QPointF *p,QTextItem *textItem)

{
  qreal dx;
  double dVar1;
  undefined4 uVar2;
  long *plVar3;
  int iVar4;
  RenderHints RVar5;
  StyleStrategy SVar6;
  QPainter *pQVar7;
  QFont *pQVar8;
  QPainter *pQVar9;
  long lVar10;
  long lVar11;
  qreal *pqVar12;
  QTransform *pQVar13;
  QPointF *pQVar14;
  long in_FS_OFFSET;
  bool bVar15;
  byte bVar16;
  QTransform matrix;
  QPainterPath path;
  QVarLengthArray<QFixedPoint,_256LL> positions;
  QPainter *local_d78;
  undefined8 local_d50;
  QImage local_d48;
  undefined4 local_d28;
  undefined2 local_d24;
  undefined8 local_d22;
  QPointF local_d18 [4];
  ushort local_cd0;
  QTransform local_cc0;
  QVarLengthArray<unsigned_int,_256LL> local_c70;
  QVarLengthArray<QFixedPoint,_256LL> local_858;
  long local_38;
  
  bVar16 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(textItem + 0x70) != 0) {
    plVar3 = *(long **)(textItem + 0x78);
    if ((int)plVar3[0x19] == 4) {
      memset(&local_858,0xaa,0x818);
      local_858.super_QVLABase<QFixedPoint>.super_QVLABaseBase.a = 0x100;
      local_858.super_QVLABase<QFixedPoint>.super_QVLABaseBase.s = 0;
      local_858.super_QVLABase<QFixedPoint>.super_QVLABaseBase.ptr =
           &local_858.super_QVLAStorage<8UL,_4UL,_256LL>;
      memset(&local_c70,0xaa,0x418);
      local_c70.super_QVLABase<unsigned_int>.super_QVLABaseBase.a = 0x100;
      local_d78 = (QPainter *)0x0;
      local_c70.super_QVLABase<unsigned_int>.super_QVLABaseBase.s = 0;
      local_c70.super_QVLABase<unsigned_int>.super_QVLABaseBase.ptr =
           &local_c70.super_QVLAStorage<4UL,_4UL,_256LL>;
      pqVar12 = (qreal *)&DAT_006ad890;
      pQVar13 = &local_cc0;
      for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
        pQVar13->m_matrix[0][0] = *pqVar12;
        pqVar12 = pqVar12 + (ulong)bVar16 * -2 + 1;
        pQVar13 = (QTransform *)((long)pQVar13 + ((ulong)bVar16 * -2 + 1) * 8);
      }
      dx = p->xp;
      dVar1 = p->yp;
      iVar4 = (**(code **)(*plVar3 + 0xf0))(plVar3);
      QTransform::fromTranslate(&local_cc0,dx,(double)iVar4 * -0.015625 + dVar1);
      QFontEngine::getGlyphPositions
                (*(QFontEngine **)(textItem + 0x78),(QGlyphLayout *)(textItem + 0x48),&local_cc0,
                 (QFlagsStorageHelper<QTextItem::RenderFlag,_4>)
                 *(QFlagsStorage<QTextItem::RenderFlag> *)(textItem + 0xc),&local_c70,&local_858);
      pQVar7 = QPaintEngineState::painter(this->state);
      QPainter::save(pQVar7);
      if (this->state != (QPaintEngineState *)0x0) {
        local_d78 = QPaintEngineState::painter(this->state);
      }
      pQVar7 = QPaintEngineState::painter(this->state);
      RVar5 = QPainter::renderHints(pQVar7);
      if (((uint)RVar5.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
                 super_QFlagsStorage<QPainter::RenderHint>.i & 2) == 0) {
        bVar15 = false;
      }
      else {
        pQVar7 = QPaintEngineState::painter(this->state);
        pQVar8 = QPainter::font(pQVar7);
        SVar6 = QFont::styleStrategy(pQVar8);
        bVar15 = (SVar6 >> 8 & 1) == 0;
      }
      QPainter::setRenderHint(local_d78,SmoothPixmapTransform,bVar15);
      if (0 < *(int *)(textItem + 0x70)) {
        lVar10 = 0;
        do {
          local_d48.d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
          local_d48.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0xaaaaaaaa;
          local_d48.super_QPaintDevice._vptr_QPaintDevice._4_4_ = 0xaaaaaaaa;
          local_d48.super_QPaintDevice.painters = 0xaaaa;
          local_d48.super_QPaintDevice._10_2_ = 0xaaaa;
          local_d48.super_QPaintDevice._12_4_ = 0xaaaaaaaa;
          plVar3 = *(long **)(textItem + 0x78);
          uVar2 = *(undefined4 *)
                   ((char *)local_c70.super_QVLABase<unsigned_int>.super_QVLABaseBase.ptr +
                   lVar10 * 4);
          local_d50 = 0;
          pqVar12 = (qreal *)&DAT_006ad908;
          pQVar14 = local_d18;
          for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
            pQVar14->xp = *pqVar12;
            pqVar12 = pqVar12 + (ulong)bVar16 * -2 + 1;
            pQVar14 = (QPointF *)&pQVar14[-(ulong)bVar16].yp;
          }
          local_cd0 = local_cd0 & 0xfc00;
          local_d28 = 0;
          local_d24 = 0xffff;
          local_d22 = 0;
          (**(code **)(*plVar3 + 0xb0))(&local_d48,plVar3,uVar2,&local_d50,local_d18,&local_d28);
          pQVar7 = QPaintEngineState::painter(this->state);
          dVar1 = (double)(int)((double)(int)((ulong)*(undefined8 *)
                                                      ((char *)local_858.super_QVLABase<QFixedPoint>
                                                               .super_QVLABaseBase.ptr + lVar10 * 8)
                                             >> 0x20) * 0.015625);
          local_d18[0].yp._0_4_ = SUB84(dVar1,0);
          local_d18[0].xp =
               (double)(int)((double)(int)*(undefined8 *)
                                           ((char *)local_858.super_QVLABase<QFixedPoint>.
                                                    super_QVLABaseBase.ptr + lVar10 * 8) * 0.015625)
          ;
          local_d18[0].yp._4_4_ = (int)((ulong)dVar1 >> 0x20);
          QPainter::drawImage(pQVar7,local_d18,&local_d48);
          QImage::~QImage(&local_d48);
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)(textItem + 0x70));
      }
      pQVar7 = QPaintEngineState::painter(this->state);
      QPainter::restore(pQVar7);
      if ((QVLAStorage<4UL,_4UL,_256LL> *)
          local_c70.super_QVLABase<unsigned_int>.super_QVLABaseBase.ptr !=
          &local_c70.super_QVLAStorage<4UL,_4UL,_256LL>) {
        QtPrivate::sizedFree
                  (local_c70.super_QVLABase<unsigned_int>.super_QVLABaseBase.ptr,
                   local_c70.super_QVLABase<unsigned_int>.super_QVLABaseBase.a << 2);
      }
      if ((QVLAStorage<8UL,_4UL,_256LL> *)
          local_858.super_QVLABase<QFixedPoint>.super_QVLABaseBase.ptr !=
          &local_858.super_QVLAStorage<8UL,_4UL,_256LL>) {
        QtPrivate::sizedFree
                  (local_858.super_QVLABase<QFixedPoint>.super_QVLABaseBase.ptr,
                   local_858.super_QVLABase<QFixedPoint>.super_QVLABaseBase.a << 3);
      }
    }
    else {
      local_c70.super_QVLABase<unsigned_int>.super_QVLABaseBase.a = (qsizetype)&DAT_aaaaaaaaaaaaaaaa
      ;
      QPainterPath::QPainterPath((QPainterPath *)&local_c70);
      QPainterPath::setFillRule((QPainterPath *)&local_c70,WindingFill);
      (**(code **)(**(long **)(textItem + 0x78) + 0x80))
                (0,0,*(long **)(textItem + 0x78),(QGlyphLayout *)(textItem + 0x48),&local_c70,
                 *(undefined4 *)(textItem + 0xc));
      bVar15 = QPainterPath::isEmpty((QPainterPath *)&local_c70);
      if (!bVar15) {
        pQVar7 = QPaintEngineState::painter(this->state);
        QPainter::save(pQVar7);
        if (this->state == (QPaintEngineState *)0x0) {
          pQVar7 = (QPainter *)0x0;
        }
        else {
          pQVar7 = QPaintEngineState::painter(this->state);
        }
        pQVar9 = QPaintEngineState::painter(this->state);
        RVar5 = QPainter::renderHints(pQVar9);
        if (((uint)RVar5.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
                   super_QFlagsStorage<QPainter::RenderHint>.i & 2) == 0) {
          bVar15 = false;
        }
        else {
          pQVar9 = QPaintEngineState::painter(this->state);
          pQVar8 = QPainter::font(pQVar9);
          SVar6 = QFont::styleStrategy(pQVar8);
          bVar15 = (SVar6 >> 8 & 1) == 0;
        }
        QPainter::setRenderHint(pQVar7,Antialiasing,bVar15);
        pQVar7 = QPaintEngineState::painter(this->state);
        local_858.super_QVLABase<QFixedPoint>.super_QVLABaseBase.a = (qsizetype)p->xp;
        local_858.super_QVLABase<QFixedPoint>.super_QVLABaseBase.s = (qsizetype)p->yp;
        QPainter::translate(pQVar7,(QPointF *)&local_858);
        if (this->state == (QPaintEngineState *)0x0) {
          pQVar7 = (QPainter *)0x0;
        }
        else {
          pQVar7 = QPaintEngineState::painter(this->state);
        }
        pQVar9 = QPaintEngineState::painter(this->state);
        QPainter::pen(pQVar9);
        QPen::brush((QPen *)&local_858);
        QPainter::fillPath(pQVar7,(QPainterPath *)&local_c70,(QBrush *)&local_858);
        QBrush::~QBrush((QBrush *)&local_858);
        pQVar7 = QPaintEngineState::painter(this->state);
        QPainter::restore(pQVar7);
      }
      QPainterPath::~QPainterPath((QPainterPath *)&local_c70);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPaintEngine::drawTextItem(const QPointF &p, const QTextItem &textItem)
{
    const QTextItemInt &ti = static_cast<const QTextItemInt &>(textItem);
    if (ti.glyphs.numGlyphs == 0)
        return;

    if (ti.fontEngine->glyphFormat == QFontEngine::Format_ARGB) {
        QVarLengthArray<QFixedPoint> positions;
        QVarLengthArray<glyph_t> glyphs;
        QTransform matrix = QTransform::fromTranslate(p.x(), p.y() - ti.fontEngine->ascent().toReal());
        ti.fontEngine->getGlyphPositions(ti.glyphs, matrix, ti.flags, glyphs, positions);
        painter()->save();
        painter()->setRenderHint(QPainter::SmoothPixmapTransform,
                                 bool((painter()->renderHints() & QPainter::TextAntialiasing)
                                      && !(painter()->font().styleStrategy() & QFont::NoAntialias)));
        for (int i = 0; i < ti.glyphs.numGlyphs; ++i) {
            QImage glyph = ti.fontEngine->bitmapForGlyph(glyphs[i], QFixedPoint(), QTransform());
            painter()->drawImage(positions[i].x.toReal(), positions[i].y.toReal(), glyph);
        }
        painter()->restore();
        return;
    }

    QPainterPath path;
    path.setFillRule(Qt::WindingFill);
    ti.fontEngine->addOutlineToPath(0, 0, ti.glyphs, &path, ti.flags);
    if (!path.isEmpty()) {
        painter()->save();
        painter()->setRenderHint(QPainter::Antialiasing,
                                 bool((painter()->renderHints() & QPainter::TextAntialiasing)
                                      && !(painter()->font().styleStrategy() & QFont::NoAntialias)));
        painter()->translate(p.x(), p.y());
        painter()->fillPath(path, painter()->pen().brush());
        painter()->restore();
    }
}